

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_logical_and_or(Context_conflict *ctx,MOJOSHADER_astExpressionBinary *ast,int left_testval)

{
  int iVar1;
  int iVar2;
  MOJOSHADER_astExpression *_ast;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  Context_conflict *pCVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *pMVar12;
  MOJOSHADER_irStatement *pMVar13;
  MOJOSHADER_irStatement *next;
  uint writemask;
  int iVar14;
  
  _ast = ast->left;
  if (_ast->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1313,
                  "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
                 );
  }
  if (ast->right->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1314,
                  "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
                 );
  }
  iVar1 = ctx->ir_label_count;
  iVar2 = ctx->ir_temp_count;
  ctx->ir_label_count = iVar1 + 4;
  ctx->ir_temp_count = iVar2 + 1;
  pMVar3 = (MOJOSHADER_irExpression *)build_ir(ctx,_ast);
  if (pMVar3 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar3->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) goto LAB_00148bde;
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar3->ir).type) goto LAB_00148bfd;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    (pMVar4->temp).index = left_testval;
  }
  iVar14 = iVar1 + 1;
  pMVar5 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar5->ir).type = MOJOSHADER_IR_CJUMP;
    (pMVar5->ir).filename = ctx->sourcefile;
    (pMVar5->ir).line = ctx->sourceline;
    (pMVar5->jump).label = 0;
    (pMVar5->move).src = pMVar3;
    (pMVar5->cjump).right = pMVar4;
    (pMVar5->cjump).iftrue = iVar1 + 2;
    (pMVar5->cjump).iffalse = iVar14;
  }
  pMVar6 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar6 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar6->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar6->ir).filename = ctx->sourcefile;
    (pMVar6->ir).line = ctx->sourceline;
    (pMVar6->jump).label = iVar1 + 2;
  }
  pMVar3 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->right);
  if (pMVar3 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar3->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
LAB_00148bde:
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar3->ir).type) {
LAB_00148bfd:
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->out_of_memory = 1;
    pCVar7 = ctx;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    pCVar7 = (Context_conflict *)&(pMVar4->temp).index;
  }
  pCVar7->isfail = 1;
  pMVar8 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (pMVar8 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar8->ir).type = MOJOSHADER_IR_CJUMP;
    (pMVar8->ir).filename = ctx->sourcefile;
    (pMVar8->ir).line = ctx->sourceline;
    (pMVar8->jump).label = 0;
    (pMVar8->move).src = pMVar3;
    (pMVar8->cjump).right = pMVar4;
    (pMVar8->cjump).iftrue = iVar1;
    (pMVar8->cjump).iffalse = iVar14;
  }
  pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar9->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar9->ir).filename = ctx->sourcefile;
    (pMVar9->ir).line = ctx->sourceline;
    (pMVar9->jump).label = iVar1;
  }
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->out_of_memory = 1;
    pCVar7 = ctx;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    pCVar7 = (Context_conflict *)((long)pMVar4 + 0x20);
  }
  pCVar7->isfail = 1;
  pMVar10 = new_ir_move(ctx,pMVar3,pMVar4,(int)pCVar7);
  writemask = (uint)pCVar7;
  pMVar11 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar11 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar11->ir).type = MOJOSHADER_IR_JUMP;
    (pMVar11->ir).filename = ctx->sourcefile;
    (pMVar11->ir).line = ctx->sourceline;
    (pMVar11->jump).label = iVar1 + 3;
  }
  pMVar12 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (pMVar12 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar12->ir).type = MOJOSHADER_IR_LABEL;
    (pMVar12->ir).filename = ctx->sourcefile;
    (pMVar12->ir).line = ctx->sourceline;
    (pMVar12->jump).label = iVar14;
  }
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    writemask = ctx->sourceline;
    (pMVar4->ir).line = writemask;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar4 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar4 + 0x1c) = 1;
    (pMVar4->temp).index = 0;
  }
  pMVar13 = new_ir_move(ctx,pMVar3,pMVar4,writemask);
  next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (next == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (next->ir).type = MOJOSHADER_IR_LABEL;
    (next->ir).filename = ctx->sourcefile;
    (next->ir).line = ctx->sourceline;
    (next->jump).label = iVar1 + 3;
  }
  pMVar13 = new_ir_seq(ctx,pMVar13,next);
  pMVar12 = new_ir_seq(ctx,pMVar12,pMVar13);
  pMVar11 = new_ir_seq(ctx,pMVar11,pMVar12);
  pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
  pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
  pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
  pMVar6 = new_ir_seq(ctx,pMVar6,pMVar8);
  pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
  pMVar3 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar3 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar3->ir).type = MOJOSHADER_IR_TEMP;
    (pMVar3->ir).filename = ctx->sourcefile;
    (pMVar3->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar3 + 0x18) = MOJOSHADER_AST_DATATYPE_BOOL;
    *(int *)((long)pMVar3 + 0x1c) = 1;
    (pMVar3->temp).index = iVar2;
  }
  pMVar3 = new_ir_eseq(ctx,pMVar5,pMVar3);
  return pMVar3;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_logical_and_or(Context *ctx,
                                    const MOJOSHADER_astExpressionBinary *ast,
                                    const int left_testval)
{
    /* The gist...
            cjump left == left_testval, maybe, f
        maybe:
            cjump right == true, t, f
        t:
            move tmp, 1
            jump join
        f:
            move tmp, 0
        join:
    */

    assert(ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
    assert(ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int maybe = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->left), new_ir_constbool(ctx, left_testval), maybe, f),
                new_ir_seq(ctx, new_ir_label(ctx, maybe),
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->right), new_ir_constbool(ctx, 1), t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 1), -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 0), -1),
                                new_ir_label(ctx, join))))))))),
                    new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1));
}